

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O1

void get_spc_info(header_t *h,byte_ *xid6,long xid6_size,track_info_t *out)

{
  byte_ *in;
  byte_ bVar1;
  uint in_size;
  byte_ *pbVar2;
  ulong uVar3;
  byte_ *pbVar4;
  byte *pbVar5;
  int iVar6;
  byte_ *pbVar7;
  long lVar8;
  uint uVar9;
  char *out_00;
  byte_ *pbVar10;
  ulong uVar11;
  bool bVar12;
  size_t local_178;
  byte local_138 [3];
  byte local_135 [261];
  
  uVar11 = 0;
  lVar8 = 0;
  do {
    uVar9 = h->len_secs[lVar8] - 0x30;
    if (uVar9 < 10) {
      uVar11 = (ulong)uVar9 + uVar11 * 10;
    }
    else {
      uVar3 = uVar11;
      if (h->author[1] == '\0' || h->author[0] != '\0') {
        uVar3 = 0;
      }
      if (lVar8 == 1) {
        uVar11 = uVar3;
      }
    }
  } while ((uVar9 < 10) && (bVar12 = lVar8 != 2, lVar8 = lVar8 + 1, bVar12));
  uVar3 = uVar11;
  if (0x1fff < (long)uVar11) {
    uVar3 = (ulong)*(ushort *)h->len_secs;
  }
  if (uVar11 == 0) {
    uVar3 = (ulong)*(ushort *)h->len_secs;
  }
  if ((long)uVar3 < 0x1fff) {
    out->length = uVar3 * 1000;
  }
  bVar12 = (byte)h->author[0] - 0x30 < 10 || h->author[0] < ' ';
  Gme_File::copy_field_(out->author,h->author + bVar12,0x20 - (uint)bVar12);
  Gme_File::copy_field_(out->song,h->song,0x20);
  Gme_File::copy_field_(out->game,h->game,0x20);
  Gme_File::copy_field_(out->dumper,h->dumper,0x10);
  Gme_File::copy_field_(out->comment,h->comment,0x20);
  if (((xid6_size != 0) && (7 < xid6_size)) && (*(int *)xid6 == 0x36646978)) {
    pbVar10 = xid6 + 8;
    pbVar7 = xid6 + (ulong)*(uint *)(xid6 + 4) + 8;
    if (xid6_size + -8 <= (long)(ulong)*(uint *)(xid6 + 4)) {
      pbVar7 = xid6 + xid6_size;
    }
    local_178 = 0;
    uVar9 = 0;
    do {
      if ((long)pbVar7 - (long)pbVar10 < 4) break;
      in_size = (uint)*(ushort *)(pbVar10 + 2);
      if (pbVar10[1] == '\0') {
        in_size = 0;
      }
      uVar11 = (ulong)in_size;
      in = pbVar10 + 4;
      pbVar2 = in;
      if ((long)uVar11 <= (long)pbVar7 - (long)in) {
        bVar1 = *pbVar10;
        switch(bVar1) {
        case '\x01':
          out_00 = out->song;
          break;
        case '\x02':
          out_00 = out->game;
          break;
        case '\x03':
          out_00 = out->author;
          break;
        case '\x04':
          out_00 = out->dumper;
          break;
        case '\a':
          out_00 = out->comment;
          break;
        default:
          if (bVar1 == '\x13') {
            local_178 = 0x100;
            if (in_size < 0x100) {
              local_178 = (size_t)in_size;
            }
            memcpy(local_135 + 2,in,local_178);
          }
          else if (bVar1 == '\x14') {
            uVar9 = (uint)*(ushort *)(pbVar10 + 2);
          }
        case '\x05':
        case '\x06':
          out_00 = (char *)0x0;
        }
        if (out_00 != (char *)0x0) {
          Gme_File::copy_field_(out_00,(char *)in,in_size);
        }
        pbVar10 = pbVar10 + uVar11 + (4 - (long)xid6);
        pbVar4 = in + uVar11;
        do {
          pbVar2 = pbVar4;
          if ((pbVar7 <= pbVar4) || (((ulong)pbVar10 & 3) == 0)) break;
          pbVar10 = pbVar10 + 1;
          bVar1 = *pbVar4;
          pbVar4 = pbVar4 + 1;
          pbVar2 = in + uVar11;
        } while (bVar1 == '\0');
      }
      pbVar10 = pbVar2;
    } while ((long)uVar11 <= (long)pbVar7 - (long)in);
    if (uVar9 == 0) {
      pbVar5 = local_135 + 2;
    }
    else {
      pbVar5 = local_135;
      local_135[1] = 0x20;
      iVar6 = -4;
      do {
        *pbVar5 = (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
        pbVar5 = pbVar5 + -1;
        uVar9 = uVar9 / 10;
        iVar6 = iVar6 + 1;
      } while (iVar6 != 0);
      local_178._0_4_ = (int)local_178 + 5;
      pbVar5 = local_138;
    }
    if ((int)local_178 != 0) {
      Gme_File::copy_field_(out->copyright,(char *)pbVar5,(int)local_178);
    }
  }
  return;
}

Assistant:

static void get_spc_info( Spc_Emu::header_t const& h, byte const* xid6, long xid6_size,
		track_info_t* out )
{
	// decode length (can be in text or binary format, sometimes ambiguous ugh)
	long len_secs = 0;
	for ( int i = 0; i < 3; i++ )
	{
		unsigned n = h.len_secs [i] - '0';
		if ( n > 9 )
		{
			// ignore single-digit text lengths
			// (except if author field is present and begins at offset 1, ugh)
			if ( i == 1 && (h.author [0] || !h.author [1]) )
				len_secs = 0;
			break;
		}
		len_secs *= 10;
		len_secs += n;
	}
	if ( !len_secs || len_secs > 0x1FFF )
		len_secs = get_le16( h.len_secs );
	if ( len_secs < 0x1FFF )
		out->length = len_secs * 1000;
	
	int offset = (h.author [0] < ' ' || unsigned (h.author [0] - '0') <= 9);
	Gme_File::copy_field_( out->author, &h.author [offset], sizeof h.author - offset );
	
	GME_COPY_FIELD( h, out, song );
	GME_COPY_FIELD( h, out, game );
	GME_COPY_FIELD( h, out, dumper );
	GME_COPY_FIELD( h, out, comment );
	
	if ( xid6_size )
		get_spc_xid6( xid6, xid6_size, out );
}